

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall
TCV::checkIfArrayCalledWithRightDimensions
          (TCV *this,Variable *variable,string *nodeName,ASTNode *node)

{
  string *__lhs;
  _Elt_pointer ppAVar1;
  bool bVar2;
  ASTNode *pAVar3;
  int *piVar4;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar5;
  size_type sVar6;
  _Elt_pointer ppAVar7;
  _Elt_pointer ppAVar8;
  _Map_pointer local_c0;
  string errorString;
  string lineNumber;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pAVar3 = AST::ASTNode::getChild(node,0);
  piVar4 = AST::ASTNode::getLineNumber(pAVar3);
  std::__cxx11::to_string(&lineNumber,*piVar4);
  if (variable->dimensions != 0) {
    pAVar3 = AST::ASTNode::getChild(node,1);
    pdVar5 = AST::ASTNode::getChildren(pAVar3);
    sVar6 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::size(pdVar5);
    piVar4 = Variable::getDimensions(variable);
    if (*piVar4 == (int)sVar6) {
      pAVar3 = AST::ASTNode::getChild(node,1);
      pdVar5 = AST::ASTNode::getChildren(pAVar3);
      ppAVar7 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
                .super__Deque_impl_data._M_start._M_cur;
      ppAVar8 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
                .super__Deque_impl_data._M_start._M_last;
      local_c0 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppAVar1 = (pdVar5->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl
                .super__Deque_impl_data._M_finish._M_cur;
      __lhs = &this->returnType;
      while (ppAVar7 != ppAVar1) {
        (**(*ppAVar7)->_vptr_ASTNode)(*ppAVar7,this);
        bVar2 = std::operator!=(__lhs,"intnum");
        if ((bVar2) && (bVar2 = std::operator!=(__lhs,"integer"), bVar2)) {
          std::operator+(&errorString,"Array dimensions should be of type integer at line ",
                         &lineNumber);
          Semantic::Detector::addError(this->detector,&errorString);
          goto LAB_0012758b;
        }
        ppAVar7 = ppAVar7 + 1;
        if (ppAVar7 == ppAVar8) {
          ppAVar7 = local_c0[1];
          local_c0 = local_c0 + 1;
          ppAVar8 = ppAVar7 + 0x40;
        }
      }
      Variable::getRawType_abi_cxx11_(&errorString,variable);
      std::__cxx11::string::operator=((string *)__lhs,(string *)&errorString);
    }
    else {
      std::operator+(&local_70,"missing dimensions for variable ",nodeName);
      std::operator+(&local_50,&local_70," at line ");
      std::operator+(&errorString,&local_50,&lineNumber);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      Semantic::Detector::addError(this->detector,&errorString);
    }
LAB_0012758b:
    std::__cxx11::string::~string((string *)&errorString);
  }
  std::__cxx11::string::~string((string *)&lineNumber);
  return;
}

Assistant:

void TCV::checkIfArrayCalledWithRightDimensions(const Variable *variable, std::string &nodeName, AST::ASTNode *node) {
    std::string lineNumber = std::to_string(node->getChild(0)->getLineNumber());
    if (variable->isArray()) {
        int indices = node->getChild(1)->getChildren().size();
        if (variable->getDimensions() != indices) {
            std::string errorString = "missing dimensions for variable " + nodeName + " at line " + lineNumber;
            detector->addError(errorString);
        } else {
            for (const auto &index : node->getChild(1)->getChildren()) {
                index->accept(*this);
                if (returnType != "intnum" && returnType != "integer") {
                    std::string errorString = "Array dimensions should be of type integer at line " + lineNumber;
                    detector->addError(errorString);
                    return;
                }
            }
            returnType = variable->getRawType();
        }
    }
}